

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O3

bool __thiscall asl::HttpMessage::hasHeader(HttpMessage *this,String *name)

{
  int iVar1;
  String local_28;
  
  capitalized(&local_28,name);
  iVar1 = Map<asl::String,_asl::String>::indexOf
                    (&(this->_headers).super_Map<asl::String,_asl::String>,&local_28);
  if (local_28._size != 0) {
    free(local_28.field_2._str);
  }
  return -1 < iVar1;
}

Assistant:

bool HttpMessage::hasHeader(const String& name) const
{
	return _headers.has(capitalized(name));
}